

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_bss.cc
# Opt level: O2

void __thiscall aliyun::Bss::Bss(Bss *this,string *host,string *appid,string *secret)

{
  char *pcVar1;
  
  pcVar1 = strdup((appid->_M_dataplus)._M_p);
  this->appid_ = pcVar1;
  pcVar1 = strdup((secret->_M_dataplus)._M_p);
  this->secret_ = pcVar1;
  pcVar1 = strdup("2014-07-14");
  this->version_ = pcVar1;
  this->region_id_ = (char *)0x0;
  this->support_tls_ = true;
  this->use_tls_ = true;
  pcVar1 = strdup((host->_M_dataplus)._M_p);
  this->host_ = pcVar1;
  this->proxy_host_ = (char *)0x0;
  return;
}

Assistant:

Bss::Bss(std::string host, std::string appid, std::string secret) {
    appid_ = strdup(appid.c_str());
    secret_ = strdup(secret.c_str());
    version_ = strdup("2014-07-14");
    region_id_ = NULL;
    use_tls_ = true;
    support_tls_ = true;
    host_ = strdup(host.c_str());
    proxy_host_ = NULL;
  }